

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_init_aarch64(CPUState *cpu)

{
  undefined4 *puVar1;
  void *pvVar2;
  gpointer pvVar3;
  undefined8 *puVar4;
  long lVar5;
  timeval tv;
  timeval local_38;
  
  pvVar2 = cpu->env_ptr;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  *(undefined2 *)((long)pvVar2 + -0x2190) = 0;
  puVar4 = (undefined8 *)((long)pvVar2 + -200);
  lVar5 = -0x2170;
  do {
    puVar1 = (undefined4 *)((long)pvVar2 + lVar5);
    *(__suseconds_t *)(puVar1 + 4) = local_38.tv_usec * 1000 + local_38.tv_sec * 1000000000;
    *(undefined1 (*) [16])(puVar1 + 6) = (undefined1  [16])0x0;
    puVar4[-1] = 0x3fc0;
    pvVar3 = g_malloc(0x4000);
    *puVar4 = pvVar3;
    pvVar3 = g_malloc(0x1000);
    *(gpointer *)(puVar1 + 0xac) = pvVar3;
    *(undefined1 (*) [16])(puVar1 + 8) = (undefined1  [16])0x0;
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    memset((void *)*puVar4,0xff,puVar4[-1] + 0x40);
    memset(puVar1 + 0xc,0xff,0x200);
    puVar4 = puVar4 + 2;
    lVar5 = lVar5 + 0x2b8;
  } while (lVar5 != -0xd0);
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}